

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v7::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  bigit bVar2;
  bigit bVar3;
  bigit bVar4;
  int *piVar5;
  ulong uVar6;
  bigit rhs_bigit;
  double_bigit sum;
  int i;
  int min_exp;
  double_bigit borrow;
  int local_38;
  int iStack_34;
  anon_class_1_0_00000001 get_bigit;
  int num_rhs_bigits;
  int local_2c;
  bigint *pbStack_28;
  int max_lhs_bigits;
  bigint *rhs_local;
  bigint *lhs2_local;
  bigint *lhs1_local;
  
  pbStack_28 = rhs;
  rhs_local = lhs2;
  lhs2_local = lhs1;
  num_rhs_bigits = bigint::num_bigits(lhs1);
  iStack_34 = bigint::num_bigits(rhs_local);
  piVar5 = std::max<int>(&num_rhs_bigits,&stack0xffffffffffffffcc);
  local_2c = *piVar5;
  local_38 = bigint::num_bigits(pbStack_28);
  if (local_2c + 1 < local_38) {
    lhs1_local._4_4_ = -1;
  }
  else if (local_38 < local_2c) {
    lhs1_local._4_4_ = 1;
  }
  else {
    borrow._7_1_ = 0;
    _i = 0;
    piVar5 = std::min<int>(&lhs2_local->exp_,&rhs_local->exp_);
    piVar5 = std::min<int>(piVar5,&pbStack_28->exp_);
    iVar1 = *piVar5;
    sum._0_4_ = local_38;
    while (sum._0_4_ = (int)sum + -1, iVar1 <= (int)sum) {
      bVar2 = add_compare::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&borrow + 7),lhs2_local,(int)sum);
      bVar3 = add_compare::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&borrow + 7),rhs_local,(int)sum);
      bVar4 = add_compare::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&borrow + 7),pbStack_28,(int)sum);
      if ((ulong)bVar4 + _i < (ulong)bVar2 + (ulong)bVar3) {
        return 1;
      }
      uVar6 = ((ulong)bVar4 + _i) - ((ulong)bVar2 + (ulong)bVar3);
      if (1 < uVar6) {
        return -1;
      }
      _i = uVar6 << 0x20;
    }
    lhs1_local._4_4_ = 0;
    if (_i != 0) {
      lhs1_local._4_4_ = -1;
    }
  }
  return lhs1_local._4_4_;
}

Assistant:

int add_compare(const bigint& lhs1, const bigint& lhs2,
                         const bigint& rhs) {
    int max_lhs_bigits = (std::max)(lhs1.num_bigits(), lhs2.num_bigits());
    int num_rhs_bigits = rhs.num_bigits();
    if (max_lhs_bigits + 1 < num_rhs_bigits) return -1;
    if (max_lhs_bigits > num_rhs_bigits) return 1;
    auto get_bigit = [](const bigint& n, int i) -> bigit {
      return i >= n.exp_ && i < n.num_bigits() ? n[i - n.exp_] : 0;
    };
    double_bigit borrow = 0;
    int min_exp = (std::min)((std::min)(lhs1.exp_, lhs2.exp_), rhs.exp_);
    for (int i = num_rhs_bigits - 1; i >= min_exp; --i) {
      double_bigit sum =
          static_cast<double_bigit>(get_bigit(lhs1, i)) + get_bigit(lhs2, i);
      bigit rhs_bigit = get_bigit(rhs, i);
      if (sum > rhs_bigit + borrow) return 1;
      borrow = rhs_bigit + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= bigit_bits;
    }
    return borrow != 0 ? -1 : 0;
  }